

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O0

void StoreNodes(st__table *storeTable,DdManager *dd,DdNode *node)

{
  DdNode *node_00;
  int iVar1;
  char *key;
  DdNode *Ne;
  DdNode *Nt;
  DdNode *N;
  DdNode *node_local;
  DdManager *dd_local;
  st__table *storeTable_local;
  
  if (*(int *)((ulong)dd & 0xfffffffffffffffe) != 0x7fffffff) {
    key = (char *)((ulong)node & 0xfffffffffffffffe);
    iVar1 = st__lookup(storeTable,key,(char **)0x0);
    if (iVar1 == 0) {
      *(int *)(key + 4) = *(int *)(key + 4) + 1;
      iVar1 = st__insert(storeTable,key,(char *)0x0);
      if (iVar1 == -10000) {
        fprintf((FILE *)dd->err,"Something wrong, st__table insert failed\n");
      }
      node_00 = *(DdNode **)(key + 0x18);
      StoreNodes(storeTable,dd,*(DdNode **)(key + 0x10));
      StoreNodes(storeTable,dd,node_00);
    }
  }
  return;
}

Assistant:

static void
StoreNodes(
  st__table * storeTable,
  DdManager * dd,
  DdNode * node)
{
    DdNode *N, *Nt, *Ne;
    if (Cudd_IsConstant(dd)) {
        return;
    }
    N = Cudd_Regular(node);
    if ( st__lookup(storeTable, (char *)N, NIL(char *))) {
        return;
    }
    cuddRef(N);
    if ( st__insert(storeTable, (char *)N, NIL(char)) == st__OUT_OF_MEM) {
        fprintf(dd->err,"Something wrong, st__table insert failed\n");
    }

    Nt = Cudd_T(N);
    Ne = Cudd_E(N);

    StoreNodes(storeTable, dd, Nt);
    StoreNodes(storeTable, dd, Ne);
    return;

}